

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  deInt32 *pdVar1;
  _Base_ptr p_Var2;
  _Rb_tree_color _Var3;
  TestStatusCode TVar4;
  char *pcVar5;
  LogFileReader **ppLVar6;
  pointer pSVar7;
  bool bVar8;
  Entry *pEVar9;
  LogFileReader *this;
  iterator iVar10;
  undefined1 auVar11 [8];
  const_iterator cVar12;
  ostream *poVar13;
  size_t sVar14;
  Error *pEVar15;
  int iVar16;
  long lVar17;
  pointer pSVar18;
  SharedPtrStateBase **ppSVar19;
  ulong uVar20;
  long lVar21;
  pointer pOVar22;
  uint uVar23;
  long lVar24;
  char *pcVar25;
  uint uVar26;
  key_type *__k;
  pointer pbVar27;
  vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> readers;
  Parser parser;
  CommandLine cmdLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  caseList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  batchNames;
  allocator<char> local_179;
  vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> local_178;
  Parser local_158;
  undefined8 local_138;
  int local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  _Base_ptr local_98;
  ShortBatchResult *local_90;
  undefined1 *puStack_88;
  pointer_____offset_0x10___ *local_80;
  undefined1 auStack_78 [16];
  SetDefaultFunc p_Stack_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ulong local_40;
  ulong local_38;
  
  local_138 = 0x100000000;
  local_130 = 0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  de::cmdline::detail::Parser::Parser(&local_158);
  de::cmdline::detail::TypedFieldMap::TypedFieldMap((TypedFieldMap *)local_108);
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 1) {
    pEVar15 = (Error *)__cxa_allocate_exception(0x10);
    xe::Error::Error(pEVar15,(char *)0x0,"argc >= 1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                     ,0x174);
    __cxa_throw(pEVar15,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
  p_Stack_68 = (SetDefaultFunc)0x0;
  local_b8._0_8_ = "f";
  local_b8._8_8_ = "format";
  local_a8._0_8_ = "Output format";
  local_a8._8_8_ = "csv";
  local_90 = (ShortBatchResult *)0x0;
  puStack_88 = opt::registerOptions(de::cmdline::detail::Parser&)::s_outputFormats;
  local_80 = (pointer_____offset_0x10___ *)
             opt::registerOptions(de::cmdline::detail::Parser&)::s_outputValues;
  auStack_78._0_8_ = 0x10;
  auStack_78._8_8_ = de::cmdline::detail::Parser::dispatchParse<opt::OutFormat>;
  de::cmdline::detail::Parser::addOption(&local_158,(OptInfo *)local_b8);
  local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
  p_Stack_68 = (SetDefaultFunc)0x0;
  local_b8._0_8_ = "m";
  local_b8._8_8_ = "mode";
  local_a8._0_8_ = "Output mode";
  local_a8._8_8_ = "all";
  local_90 = (ShortBatchResult *)0x0;
  puStack_88 = opt::registerOptions(de::cmdline::detail::Parser&)::s_outputModes;
  local_80 = (pointer_____offset_0x10___ *)
             opt::registerOptions(de::cmdline::detail::Parser&)::s_outputFormats;
  auStack_78._0_8_ = 0x10;
  auStack_78._8_8_ = de::cmdline::detail::Parser::dispatchParse<opt::OutMode>;
  de::cmdline::detail::Parser::addOption(&local_158,(OptInfo *)local_b8);
  local_98 = (_Base_ptr)((ulong)local_98 & 0xffffffffffffff00);
  p_Stack_68 = (SetDefaultFunc)0x0;
  local_b8._0_8_ = "v";
  local_b8._8_8_ = "value";
  local_a8._0_8_ = "Value to extract";
  local_a8._8_8_ = (long)"status code" + 7;
  local_90 = (ShortBatchResult *)0x0;
  puStack_88 = opt::registerOptions(de::cmdline::detail::Parser&)::s_outputValues;
  local_80 = &opt::OutValue::typeinfo;
  auStack_78._0_8_ = 0x10;
  auStack_78._8_8_ = de::cmdline::detail::Parser::dispatchParse<opt::OutValue>;
  de::cmdline::detail::Parser::addOption(&local_158,(OptInfo *)local_b8);
  bVar8 = de::cmdline::detail::Parser::parse
                    (&local_158,argc + -1,argv + 1,(CommandLine *)local_108,(ostream *)&std::cerr);
  if ((bVar8) &&
     (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pEVar9 = de::cmdline::detail::TypedFieldMap::get
                       ((TypedFieldMap *)local_108,(type_info *)&opt::OutFormat::typeinfo);
    local_138._4_4_ = *pEVar9->value;
    pEVar9 = de::cmdline::detail::TypedFieldMap::get
                       ((TypedFieldMap *)local_108,(type_info *)&opt::OutMode::typeinfo);
    local_138 = CONCAT44(local_138._4_4_,*pEVar9->value);
    pEVar9 = de::cmdline::detail::TypedFieldMap::get
                       ((TypedFieldMap *)local_108,(type_info *)&opt::OutValue::typeinfo);
    local_130 = *pEVar9->value;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_128,&local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    de::cmdline::detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_108);
    de::cmdline::detail::Parser::~Parser(&local_158);
    local_158.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pEVar15 = (Error *)__cxa_allocate_exception(0x10);
      xe::Error::Error(pEVar15,(char *)0x0,"!cmdLine.filenames.empty()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                       ,0x10e);
      __cxa_throw(pEVar15,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::resize
              ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)&local_158,
               (long)local_128.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_128.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    local_178.
    super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < (int)((ulong)((long)local_128.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_128.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      lVar21 = 0;
      lVar17 = 0;
      lVar24 = 0;
      do {
        pbVar27 = local_128.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this = (LogFileReader *)operator_new(0x40);
        LogFileReader::LogFileReader
                  (this,(ShortBatchResult *)
                        ((long)&(local_158.m_options.
                                 super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->shortName + lVar21),
                   *(char **)((long)&(pbVar27->_M_dataplus)._M_p + lVar17));
        local_b8._8_8_ = (SharedPtrStateBase *)0x0;
        local_b8._0_8_ = this;
        local_b8._8_8_ = operator_new(0x20);
        ((SharedPtrStateBase *)local_b8._8_8_)->strongRefCount = 0;
        ((SharedPtrStateBase *)local_b8._8_8_)->weakRefCount = 0;
        ((SharedPtrStateBase *)local_b8._8_8_)->_vptr_SharedPtrStateBase =
             (_func_int **)&PTR__SharedPtrState_0012df70;
        ((SharedPtrStateBase *)(local_b8._8_8_ + 0x10))->_vptr_SharedPtrStateBase =
             (_func_int **)this;
        ((SharedPtrStateBase *)local_b8._8_8_)->strongRefCount = 1;
        ((SharedPtrStateBase *)local_b8._8_8_)->weakRefCount = 1;
        std::vector<de::SharedPtr<LogFileReader>,std::allocator<de::SharedPtr<LogFileReader>>>::
        emplace_back<de::SharedPtr<LogFileReader>>
                  ((vector<de::SharedPtr<LogFileReader>,std::allocator<de::SharedPtr<LogFileReader>>>
                    *)&local_178,(SharedPtr<LogFileReader> *)local_b8);
        if ((SharedPtrStateBase *)local_b8._8_8_ != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = (deInt32 *)(local_b8._8_8_ + 8);
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_b8._0_8_ = (LogFileReader *)0x0;
            (*(*(_func_int ***)local_b8._8_8_)[2])();
          }
          LOCK();
          pdVar1 = (deInt32 *)(local_b8._8_8_ + 0xc);
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if ((SharedPtrStateBase *)local_b8._8_8_ != (SharedPtrStateBase *)0x0) {
              (*(*(_func_int ***)local_b8._8_8_)[1])();
            }
            local_b8._8_8_ = (SharedPtrStateBase *)0x0;
          }
        }
        de::Thread::start(&(local_178.
                            super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->super_Thread);
        lVar24 = lVar24 + 1;
        lVar17 = lVar17 + 0x20;
        lVar21 = lVar21 + 0x48;
      } while (lVar24 < (int)((ulong)((long)local_128.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_128.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if (0 < (int)((ulong)((long)local_128.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_128.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      lVar17 = 0;
      lVar21 = 0;
      do {
        de::Thread::join(*(Thread **)
                          ((long)&(local_178.
                                   super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_108,
                   *(char **)((long)&((local_128.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar17 * 2),&local_179);
        de::FilePath::getBaseName_abi_cxx11_((string *)local_b8,(FilePath *)local_108);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   (string *)local_b8);
        if ((LogFileReader *)local_b8._0_8_ != (LogFileReader *)local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
        }
        if (local_108 != (undefined1  [8])&local_f8) {
          operator_delete((void *)local_108,(ulong)(local_f8._M_dataplus._M_p + 1));
        }
        lVar21 = lVar21 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar21 < (int)((ulong)((long)local_128.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_128.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    std::vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::
    ~vector(&local_178);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_108 = (undefined1  [8])0x0;
    pbStack_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    p_Var2 = (_Base_ptr)(local_b8 + 8);
    local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
    local_a8._0_8_ = (char *)0x0;
    local_90 = (ShortBatchResult *)0x0;
    local_a8._8_8_ = p_Var2;
    local_98 = p_Var2;
    if (local_158.m_options.
        super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_158.m_options.
        super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pOVar22 = local_158.m_options.
                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        for (__k = (key_type *)pOVar22->shortName; __k != (key_type *)pOVar22->longName;
            __k = (key_type *)&__k[2]._M_string_length) {
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_b8,__k);
          if (iVar10._M_node == p_Var2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_108,__k);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_b8,__k);
          }
        }
        pOVar22 = (pointer)&pOVar22->dispatchParse;
      } while (pOVar22 !=
               local_158.m_options.
               super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
    uVar20 = (long)pbStack_100 - (long)local_108;
    if (local_138._4_4_ == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TestCasePath",0xc);
      pbVar27 = local_58.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(pbVar27->_M_dataplus)._M_p,pbVar27->_M_string_length);
          pbVar27 = pbVar27 + 1;
        } while (pbVar27 !=
                 local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    local_40 = uVar20;
    if (local_108 == (undefined1  [8])pbStack_100) {
      uVar26 = 0;
    }
    else {
      uVar20 = 0;
      auVar11 = local_108;
      do {
        local_178.
        super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.
        super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178.
        super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar25 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar11)->
                  _M_dataplus)._M_p;
        local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar11;
        local_38 = uVar20;
        std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::resize
                  ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
                   &local_178,
                   ((long)local_158.m_options.
                          super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_158.m_options.
                          super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
        pSVar18 = local_178.
                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)local_158.m_options.
                                    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_158.m_options.
                                   super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
          lVar17 = 0;
          lVar21 = 0;
          do {
            pOVar22 = local_158.m_options.
                      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b8,pcVar25,&local_179);
            cVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)((long)&pOVar22->defaultValue + lVar17),(key_type *)local_b8);
            if ((LogFileReader *)local_b8._0_8_ != (LogFileReader *)local_a8) {
              operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
            }
            pSVar18 = local_178.
                      super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((_Base_ptr)(&pOVar22->isFlag + lVar17) == cVar12._M_node) {
              pcVar5 = *(char **)((long)&(local_178.
                                          super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                 lVar17);
              ppLVar6 = &(local_178.
                          super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
              strlen(pcVar25);
              std::__cxx11::string::_M_replace((long)ppLVar6 + lVar17,0,pcVar5,(ulong)pcVar25);
              *(undefined8 *)
               ((long)&local_178.
                       super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2].m_ptr + lVar17) = 0xe00000000;
            }
            else {
              _Var3 = cVar12._M_node[2]._M_color;
              lVar24 = *(long *)((long)&pOVar22->shortName + lVar17);
              std::__cxx11::string::_M_assign
                        ((string *)
                         ((long)&(local_178.
                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17));
              *(undefined8 *)((long)&pSVar18[2].m_ptr + lVar17) =
                   *(undefined8 *)((long)(int)_Var3 * 0x48 + lVar24 + 0x20);
              std::__cxx11::string::_M_assign((string *)((long)&pSVar18[2].m_state + lVar17));
            }
            lVar21 = lVar21 + 1;
            lVar17 = lVar17 + 0x48;
            pSVar18 = local_178.
                      super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (lVar21 < (int)((ulong)((long)local_158.m_options.
                                                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_158.m_options.
                                               super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            0x38e38e39);
        }
        do {
          ppSVar19 = &pSVar18[4].m_state;
          if ((pointer)ppSVar19 ==
              local_178.
              super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) break;
          pSVar7 = pSVar18 + 6;
          pSVar18 = (pointer)ppSVar19;
        } while (*(int *)((long)&pSVar7->m_state + 4) ==
                 *(int *)((long)&local_178.
                                 super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].m_ptr + 4));
        bVar8 = (pointer)ppSVar19 ==
                local_178.
                super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if ((!bVar8) || ((int)local_138 == 0)) {
          if (local_138._4_4_ == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(local_110->_M_dataplus)._M_p,
                       local_110->_M_string_length);
            for (pSVar18 = local_178.
                           super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pSVar18 !=
                local_178.
                super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar18 = (pointer)&pSVar18[4].m_state)
            {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
              if (local_130 == 0) {
                TVar4 = *(TestStatusCode *)((long)&pSVar18[2].m_ptr + 4);
                pcVar25 = "Missing";
                if (TVar4 != TESTSTATUSCODE_LAST) {
                  pcVar25 = xe::getTestStatusCodeName(TVar4);
                }
              }
              else {
                pcVar25 = (char *)pSVar18[2].m_state;
              }
              if ((SharedPtrStateBase *)pcVar25 == (SharedPtrStateBase *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x130218);
              }
              else {
                sVar14 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar25,sVar14);
              }
            }
          }
          else {
            if (local_138._4_4_ != 0) goto LAB_00112238;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(local_110->_M_dataplus)._M_p,
                                 local_110->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            if (0 < (int)((ulong)((long)local_178.
                                        super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_178.
                                       super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39
               ) {
              lVar24 = 8;
              lVar17 = 0;
              lVar21 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     *(char **)((long)local_58.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                               lVar24 + -8),
                                     *(long *)((long)&((local_58.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar24));
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
                TVar4 = *(TestStatusCode *)
                         ((long)&local_178.
                                 super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].m_ptr + lVar17 + 4);
                pcVar25 = "Missing";
                if (TVar4 != TESTSTATUSCODE_LAST) {
                  pcVar25 = xe::getTestStatusCodeName(TVar4);
                }
                if (pcVar25 == (char *)0x0) {
                  std::ios::clear((int)poVar13 + (int)*(undefined8 *)(*(long *)poVar13 + -0x18));
                }
                else {
                  sVar14 = strlen(pcVar25);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar25,sVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar13," (",2);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar13,*(char **)((long)&local_178.
                                                                                                                              
                                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  m_state + lVar17),
                                     *(long *)((long)&local_178.
                                                                                                            
                                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].m_ptr
                                              + lVar17));
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,")\n",2);
                lVar21 = lVar21 + 1;
                lVar17 = lVar17 + 0x48;
                lVar24 = lVar24 + 0x20;
              } while (lVar21 < (int)((ulong)((long)local_178.
                                                                                                        
                                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_178.
                                                                                                      
                                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                0x38e38e39);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
LAB_00112238:
        uVar26 = (int)local_38 + (uint)bVar8;
        uVar20 = (ulong)uVar26;
        std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::~vector
                  ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
                   &local_178);
        auVar11 = (undefined1  [8])(local_110 + 1);
      } while (auVar11 != (undefined1  [8])pbStack_100);
    }
    uVar23 = (uint)(local_40 >> 5);
    if (local_138._4_4_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar26);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," / ",3);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,uVar23);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," test case results match.\n",0x1a)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Comparison ",0xd);
      pcVar25 = "passed";
      if (uVar26 != uVar23) {
        pcVar25 = "FAILED";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar25,6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    iVar16 = -(uint)(uVar26 != uVar23);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::~vector
              ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)&local_158);
  }
  else {
    pcVar25 = *argv;
    if (pcVar25 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x130218);
    }
    else {
      sVar14 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar25,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": [options] [filenames]\n",0x18);
    de::cmdline::detail::Parser::help(&local_158,(ostream *)&std::cout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    de::cmdline::detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_108);
    de::cmdline::detail::Parser::~Parser(&local_158);
    iVar16 = -1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return iVar16;
}

Assistant:

int main (int argc, const char* const* argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
		return -1;

	try
	{
		bool compareOk = runCompare(cmdLine, std::cout);
		return compareOk ? 0 : -1;
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}
}